

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InMemMsgLoader.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::InMemMsgLoader::loadMsg
          (InMemMsgLoader *this,XMLMsgId msgToLoad,XMLCh *toFill,XMLSize_t maxChars)

{
  XMLCh *pXVar1;
  XMLCh XVar2;
  bool bVar3;
  undefined1 *puVar4;
  XMLCh *pXVar5;
  long lVar6;
  
  bVar3 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgXMLErrDomain);
  if (bVar3) {
    if (0x120 < msgToLoad) {
      return false;
    }
    lVar6 = (ulong)(msgToLoad - 1) << 8;
    puVar4 = gXMLErrArray;
  }
  else {
    bVar3 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgExceptDomain);
    if (bVar3) {
      if (0x171 < msgToLoad) {
        return false;
      }
      lVar6 = (ulong)(msgToLoad - 1) << 8;
      puVar4 = gXMLExceptArray;
    }
    else {
      bVar3 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgValidityDomain);
      if (bVar3) {
        if (0x54 < msgToLoad) {
          return false;
        }
        lVar6 = (ulong)(msgToLoad - 1) << 8;
        puVar4 = gXMLValidityArray;
      }
      else {
        bVar3 = XMLString::equals(this->fMsgDomain,(XMLCh *)XMLUni::fgXMLDOMMsgDomain);
        if (0x29 < msgToLoad) {
          return false;
        }
        if (!bVar3) {
          return false;
        }
        lVar6 = (ulong)(msgToLoad - 1) << 8;
        puVar4 = gXMLDOMMsgArray;
      }
    }
  }
  pXVar5 = (XMLCh *)(puVar4 + lVar6);
  pXVar1 = toFill + maxChars;
  for (; (XVar2 = *pXVar5, XVar2 != L'\0' && (toFill < pXVar1)); toFill = toFill + 1) {
    pXVar5 = pXVar5 + 1;
    *toFill = XVar2;
  }
  *toFill = L'\0';
  return true;
}

Assistant:

bool InMemMsgLoader::loadMsg(const  XMLMsgLoader::XMLMsgId  msgToLoad
                            ,       XMLCh* const            toFill
                            , const XMLSize_t               maxChars)
{
    //
    //  Just use the id to map into the correct array of messages. Then
    //  copy that to the caller's buffer.
    //
    //  NOTE:   The source text is in little endian form. So, if we are a
    //          big endian machine, flip them in the process.
    //
    XMLCh* endPtr = toFill + maxChars;
    XMLCh* outPtr = toFill;
    const XMLCh* srcPtr = 0;

    if (XMLString::equals(fMsgDomain, XMLUni::fgXMLErrDomain))
    {
        if ( msgToLoad > gXMLErrArraySize)
            return false;
        else
            srcPtr = gXMLErrArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgExceptDomain))
    {
         if ( msgToLoad > gXMLExceptArraySize)
            return false;
         else
             srcPtr = gXMLExceptArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgValidityDomain))
    {
         if ( msgToLoad > gXMLValidityArraySize)
            return false;
         else
             srcPtr = gXMLValidityArray[msgToLoad - 1];
    }
     else if (XMLString::equals(fMsgDomain, XMLUni::fgXMLDOMMsgDomain))
    {
         if ( msgToLoad > gXMLDOMMsgArraySize)
            return false;
         else
             srcPtr = gXMLDOMMsgArray[msgToLoad - 1];
    } else {
	return false;
    }

     while (*srcPtr && (outPtr < endPtr))
     {
         *outPtr++ = *srcPtr++;
     }
     *outPtr = 0;

     return true;
}